

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMemoryFile.cpp
# Opt level: O0

ssize_t __thiscall
irr::io::CMemoryReadFile::read(CMemoryReadFile *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  c8 *p;
  long amount;
  void *local_28;
  void *local_8;
  
  local_28 = __buf;
  if (this->Len < this->Pos + (long)__buf) {
    local_28 = (void *)(this->Len - this->Pos);
  }
  if ((long)local_28 < 1) {
    local_8 = (void *)0x0;
  }
  else {
    memcpy((void *)CONCAT44(in_register_00000034,__fd),(void *)((long)this->Buffer + this->Pos),
           (size_t)local_28);
    this->Pos = (long)local_28 + this->Pos;
    local_8 = local_28;
  }
  return (ssize_t)local_8;
}

Assistant:

size_t CMemoryReadFile::read(void *buffer, size_t sizeToRead)
{
	long amount = static_cast<long>(sizeToRead);
	if (Pos + amount > Len)
		amount -= Pos + amount - Len;

	if (amount <= 0)
		return 0;

	c8 *p = (c8 *)Buffer;
	memcpy(buffer, p + Pos, amount);

	Pos += amount;

	return static_cast<size_t>(amount);
}